

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O3

void __thiscall tcu::ThreadUtil::MessageBuilder::operator<<(MessageBuilder *this,EndToken *param_1)

{
  Thread *this_00;
  string local_30;
  
  this_00 = this->m_thread;
  std::__cxx11::stringbuf::str();
  Thread::pushMessage(this_00,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void MessageBuilder::operator<< (const EndToken&)
{
	m_thread.pushMessage(m_stream.str());
}